

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servlk.cpp
# Opt level: O2

UnicodeString * __thiscall icu_63::LocaleKey::prefix(LocaleKey *this,UnicodeString *result)

{
  UnicodeString temp;
  UChar buffer [64];
  
  if (this->_kind != 0xffffffff) {
    uprv_itou_63(buffer,0x40,this->_kind,10,0);
    UnicodeString::UnicodeString(&temp,buffer);
    UnicodeString::append(result,&temp);
    UnicodeString::~UnicodeString(&temp);
  }
  return result;
}

Assistant:

UnicodeString&
LocaleKey::prefix(UnicodeString& result) const {
    if (_kind != KIND_ANY) {
        UChar buffer[64];
        uprv_itou(buffer, 64, _kind, 10, 0);
        UnicodeString temp(buffer);
        result.append(temp);
    }
    return result;
}